

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_close_stream(nghttp2_session *session,int32_t stream_id,uint32_t error_code)

{
  int iVar1;
  int iVar2;
  nghttp2_stream *stream_00;
  uint32_t in_EDX;
  int32_t in_ESI;
  nghttp2_session *in_RDI;
  nghttp2_outbound_item *item;
  int is_my_stream_id;
  nghttp2_mem *mem;
  nghttp2_stream *stream;
  int rv;
  nghttp2_stream *in_stack_ffffffffffffffb8;
  nghttp2_session *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  stream_00 = nghttp2_session_get_stream
                        ((nghttp2_session *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         (int32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  if (stream_00 == (nghttp2_stream *)0x0) {
    local_4 = -0x1f5;
  }
  else if (((in_RDI->callbacks).on_stream_close_callback == (nghttp2_on_stream_close_callback)0x0)
          || (iVar1 = (*(in_RDI->callbacks).on_stream_close_callback)
                                (in_RDI,in_ESI,in_EDX,in_RDI->user_data), iVar1 == 0)) {
    if (stream_00->item != (nghttp2_outbound_item *)0x0) {
      in_stack_ffffffffffffffc0 = (nghttp2_session *)stream_00->item;
      session_detach_stream_item(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if ((*(char *)&(in_stack_ffffffffffffffc0->root).sib_next == '\0') &&
         (in_stack_ffffffffffffffc0 != (nghttp2_session *)(in_RDI->aob).item)) {
        nghttp2_outbound_item_free
                  ((nghttp2_outbound_item *)
                   CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   (nghttp2_mem *)stream_00);
        nghttp2_mem_free((nghttp2_mem *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
    }
    iVar1 = nghttp2_session_is_my_stream_id(in_RDI,in_ESI);
    if ((stream_00->flags & 1) == 0) {
      if (iVar1 == 0) {
        in_RDI->num_incoming_streams = in_RDI->num_incoming_streams - 1;
      }
      else {
        in_RDI->num_outgoing_streams = in_RDI->num_outgoing_streams - 1;
      }
    }
    else if (iVar1 == 0) {
      in_RDI->num_incoming_reserved_streams = in_RDI->num_incoming_reserved_streams - 1;
    }
    stream_00->flags = stream_00->flags | 2;
    if (in_RDI->pending_no_rfc7540_priorities == '\x01') {
      local_4 = nghttp2_session_destroy_stream
                          ((nghttp2_session *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
                           (nghttp2_stream *)in_stack_ffffffffffffffc0);
    }
    else {
      if (((((in_RDI->opt_flags & 0x10) == 0) && (in_RDI->server != '\0')) && (iVar1 == 0)) &&
         (iVar2 = nghttp2_stream_in_dep_tree(stream_00), iVar2 != 0)) {
        nghttp2_session_keep_closed_stream(in_RDI,stream_00);
      }
      else {
        iVar1 = nghttp2_session_destroy_stream
                          ((nghttp2_session *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
                           (nghttp2_stream *)in_stack_ffffffffffffffc0);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = -0x386;
  }
  return local_4;
}

Assistant:

int nghttp2_session_close_stream(nghttp2_session *session, int32_t stream_id,
                                 uint32_t error_code) {
  int rv;
  nghttp2_stream *stream;
  nghttp2_mem *mem;
  int is_my_stream_id;

  mem = &session->mem;
  stream = nghttp2_session_get_stream(session, stream_id);

  if (!stream) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  DEBUGF("stream: stream(%p)=%d close\n", stream, stream->stream_id);

  /* We call on_stream_close_callback even if stream->state is
     NGHTTP2_STREAM_INITIAL. This will happen while sending request
     HEADERS, a local endpoint receives RST_STREAM for that stream. It
     may be PROTOCOL_ERROR, but without notifying stream closure will
     hang the stream in a local endpoint.
  */

  if (session->callbacks.on_stream_close_callback) {
    if (session->callbacks.on_stream_close_callback(
          session, stream_id, error_code, session->user_data) != 0) {
      return NGHTTP2_ERR_CALLBACK_FAILURE;
    }
  }

  if (stream->item) {
    nghttp2_outbound_item *item;

    item = stream->item;

    session_detach_stream_item(session, stream);

    /* If item is queued, it will be deleted when it is popped
       (nghttp2_session_prep_frame() will fail).  If session->aob.item
       points to this item, let active_outbound_item_reset()
       free the item. */
    if (!item->queued && item != session->aob.item) {
      nghttp2_outbound_item_free(item, mem);
      nghttp2_mem_free(mem, item);
    }
  }

  is_my_stream_id = nghttp2_session_is_my_stream_id(session, stream_id);

  /* pushed streams which is not opened yet is not counted toward max
     concurrent limits */
  if ((stream->flags & NGHTTP2_STREAM_FLAG_PUSH)) {
    if (!is_my_stream_id) {
      --session->num_incoming_reserved_streams;
    }
  } else {
    if (is_my_stream_id) {
      --session->num_outgoing_streams;
    } else {
      --session->num_incoming_streams;
    }
  }

  /* Closes both directions just in case they are not closed yet */
  stream->flags |= NGHTTP2_STREAM_FLAG_CLOSED;

  if (session->pending_no_rfc7540_priorities == 1) {
    return nghttp2_session_destroy_stream(session, stream);
  }

  if ((session->opt_flags & NGHTTP2_OPTMASK_NO_CLOSED_STREAMS) == 0 &&
      session->server && !is_my_stream_id &&
      nghttp2_stream_in_dep_tree(stream)) {
    /* On server side, retain stream at most MAX_CONCURRENT_STREAMS
       combined with the current active incoming streams to make
       dependency tree work better. */
    nghttp2_session_keep_closed_stream(session, stream);
  } else {
    rv = nghttp2_session_destroy_stream(session, stream);
    if (rv != 0) {
      return rv;
    }
  }

  return 0;
}